

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDataCollectionSegment::FetchChunk
          (ColumnDataCollectionSegment *this,idx_t chunk_idx,DataChunk *result,
          vector<unsigned_long,_true> *column_ids)

{
  ChunkManagementState state;
  ChunkManagementState local_48;
  
  local_48.handles._M_h._M_buckets = &local_48.handles._M_h._M_single_bucket;
  local_48.handles._M_h._M_bucket_count = 1;
  local_48.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_48.handles._M_h._M_element_count = 0;
  local_48.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_48.handles._M_h._M_rehash_policy._M_next_resize = 0;
  local_48.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_48.properties = DISALLOW_ZERO_COPY;
  ReadChunk(this,chunk_idx,&local_48,result,column_ids);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_48);
  return;
}

Assistant:

void ColumnDataCollectionSegment::FetchChunk(idx_t chunk_idx, DataChunk &result, const vector<column_t> &column_ids) {
	D_ASSERT(chunk_idx < chunk_data.size());
	ChunkManagementState state;
	state.properties = ColumnDataScanProperties::DISALLOW_ZERO_COPY;
	ReadChunk(chunk_idx, state, result, column_ids);
}